

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

bool doctest::detail::checkIfShouldThrow(Enum assert_type)

{
  bool bVar1;
  
  bVar1 = true;
  if ((assert_type & DT_REQUIRE) == 0) {
    if ((((assert_type & DT_CHECK) != 0) && (0 < getContextState::data->abort_after)) &&
       (getContextState::data->abort_after <= getContextState::data->numFailedAssertions)) {
      return true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool checkIfShouldThrow(assertType::Enum assert_type) {
        if(assert_type & assertType::is_require)
            return true;

        if((assert_type & assertType::is_check) && getContextState()->abort_after > 0) {
            if(getContextState()->numFailedAssertions >= getContextState()->abort_after)
                return true;
        }

        return false;
    }